

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaNormalTargetGenerator::LanguageLinkerCudaFatbinaryRule
          (string *__return_storage_ptr__,cmNinjaNormalTargetGenerator *this,string *config)

{
  string *name;
  char local_6d [13];
  string local_60;
  string local_40;
  string *local_20;
  string *config_local;
  cmNinjaNormalTargetGenerator *this_local;
  
  local_20 = config;
  config_local = (string *)this;
  this_local = (cmNinjaNormalTargetGenerator *)__return_storage_ptr__;
  TargetLinkLanguage(&local_40,this,config);
  name = cmGeneratorTarget::GetName_abi_cxx11_
                   ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                    GeneratorTarget);
  cmGlobalNinjaGenerator::EncodeRuleName(&local_60,name);
  local_6d[0] = '_';
  cmStrCat<std::__cxx11::string,char_const(&)[13],std::__cxx11::string,char,std::__cxx11::string_const&>
            (__return_storage_ptr__,&local_40,(char (*) [13])"_FATBINARY__",&local_60,local_6d,
             local_20);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaNormalTargetGenerator::LanguageLinkerCudaFatbinaryRule(
  const std::string& config) const
{
  return cmStrCat(
    this->TargetLinkLanguage(config), "_FATBINARY__",
    cmGlobalNinjaGenerator::EncodeRuleName(this->GeneratorTarget->GetName()),
    '_', config);
}